

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_io.c
# Opt level: O0

size_t Qiniu_ReadBuf_Read(void *buf,size_t unused,size_t n,Qiniu_ReadBuf *self)

{
  Qiniu_ReadBuf *pQVar1;
  Qiniu_Int64 max;
  Qiniu_ReadBuf *self_local;
  size_t n_local;
  size_t unused_local;
  void *buf_local;
  
  pQVar1 = (Qiniu_ReadBuf *)(self->limit - self->off);
  if ((long)pQVar1 < 1) {
    buf_local = (void *)0x0;
  }
  else {
    self_local = (Qiniu_ReadBuf *)n;
    if ((long)pQVar1 < (long)n) {
      self_local = pQVar1;
    }
    memcpy(buf,self->buf + self->off,(size_t)self_local);
    self->off = (long)&self_local->buf + self->off;
    buf_local = self_local;
  }
  return (size_t)buf_local;
}

Assistant:

static size_t Qiniu_ReadBuf_Read(void *buf, size_t unused, size_t n, Qiniu_ReadBuf *self)
{
	Qiniu_Int64 max = self->limit - self->off;
	if (max <= 0)
	{
		return 0;
	}
	if ((Qiniu_Int64)n > max)
	{
		n = max & (~(size_t)0L);
	}
	memcpy(buf, self->buf + self->off, n);
	self->off += n;
	return n;
}